

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __thiscall
ConvertedString::ConvertedString(ConvertedString *this,char *fortran_str,size_t size)

{
  int gtid;
  kmp_info_t *pkVar1;
  void *pvVar2;
  size_t in_RDX;
  char *in_RSI;
  kmp_info_t *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  gtid = __kmp_get_global_thread_id();
  pkVar1 = __kmp_thread_from_gtid(gtid);
  *(kmp_info_t **)(in_RDI->th_pad + 8) = pkVar1;
  pvVar2 = ___kmp_thread_malloc(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI->th_align = (double)pvVar2;
  strncpy((char *)in_RDI->th_align,in_RSI,in_RDX);
  *(undefined1 *)((long)in_RDI->th_align + in_RDX) = 0;
  return;
}

Assistant:

ConvertedString(char const *fortran_str, size_t size) {
    th = __kmp_get_thread();
    buf = (char *)__kmp_thread_malloc(th, size + 1);
    KMP_STRNCPY_S(buf, size + 1, fortran_str, size);
    buf[size] = '\0';
  }